

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_pixel_ops.cpp
# Opt level: O3

bool dxil_spv::emit_inner_coverage_instruction(Impl *impl,CallInst *instruction)

{
  Id IVar1;
  Id type_id;
  Builder *this;
  Operation *this_00;
  Operation *this_01;
  Capability local_2c;
  
  this = Converter::Impl::builder(impl);
  IVar1 = SPIRVModule::get_builtin_shader_input(impl->spirv_module,BuiltInFullyCoveredEXT);
  local_2c = CapabilityFragmentFullyCoveredEXT;
  std::
  _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
  ::_M_insert_unique<spv::Capability_const&>
            ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
              *)&this->capabilities,&local_2c);
  spv::Builder::addExtension(this,"SPV_EXT_fragment_fully_covered");
  type_id = spv::Builder::makeBoolType(this);
  this_00 = Converter::Impl::allocate(impl,OpLoad,type_id);
  Operation::add_id(this_00,IVar1);
  Converter::Impl::add(impl,this_00,false);
  this_01 = Converter::Impl::allocate(impl,OpSelect,(Value *)instruction);
  Operation::add_id(this_01,this_00->id);
  IVar1 = spv::Builder::makeIntegerType(this,0x20,false);
  IVar1 = spv::Builder::makeIntConstant(this,IVar1,1,false);
  Operation::add_id(this_01,IVar1);
  IVar1 = spv::Builder::makeIntegerType(this,0x20,false);
  IVar1 = spv::Builder::makeIntConstant(this,IVar1,0,false);
  Operation::add_id(this_01,IVar1);
  Converter::Impl::add(impl,this_01,false);
  return true;
}

Assistant:

bool emit_inner_coverage_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();
	spv::Id var_id = impl.spirv_module.get_builtin_shader_input(spv::BuiltInFullyCoveredEXT);

	builder.addCapability(spv::CapabilityFragmentFullyCoveredEXT);
	builder.addExtension("SPV_EXT_fragment_fully_covered");

	Operation *load_op = impl.allocate(spv::OpLoad, builder.makeBoolType());
	load_op->add_id(var_id);
	impl.add(load_op);

	auto *select_op = impl.allocate(spv::OpSelect, instruction);
	select_op->add_id(load_op->id);
	select_op->add_id(builder.makeUintConstant(1));
	select_op->add_id(builder.makeUintConstant(0));
	impl.add(select_op);
	return true;
}